

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall crnd::crn_unpacker::decode_color_selectors(crn_unpacker *this)

{
  uint8 *puVar1;
  uint uVar2;
  uint uVar3;
  uint32 uVar4;
  uint *puVar5;
  uint32 local_d8;
  bool local_81;
  bool local_71;
  uint32 s1;
  uint32 s0;
  uint32 w;
  uint32 h;
  uint32 t;
  uint32 selector;
  uint32 j;
  uint32 i;
  uint32 s;
  undefined1 local_40 [8];
  static_huffman_data_model dm;
  bool has_subblocks;
  bool has_etc_color_blocks;
  crn_unpacker *this_local;
  
  uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                    ((crn_packed_uint *)&this->m_pHeader->m_format);
  local_71 = true;
  if (uVar2 != 10) {
    uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                      ((crn_packed_uint *)&this->m_pHeader->m_format);
    local_71 = true;
    if (uVar2 != 0xb) {
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&this->m_pHeader->m_format);
      local_71 = true;
      if (uVar2 != 0xc) {
        uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                          ((crn_packed_uint *)&this->m_pHeader->m_format);
        local_71 = true;
        if (uVar2 != 0xd) {
          uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)&this->m_pHeader->m_format);
          local_71 = uVar2 == 0xe;
        }
      }
    }
  }
  dm.m_pDecode_tables._7_1_ = local_71;
  uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                    ((crn_packed_uint *)&this->m_pHeader->m_format);
  local_81 = true;
  if (uVar2 != 10) {
    uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                      ((crn_packed_uint *)&this->m_pHeader->m_format);
    local_81 = true;
    if (uVar2 != 0xb) {
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&this->m_pHeader->m_format);
      local_81 = uVar2 == 0xc;
    }
  }
  dm.m_pDecode_tables._6_1_ = local_81;
  puVar1 = this->m_pData;
  uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                    ((crn_packed_uint *)&this->m_pHeader->m_color_selectors);
  uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                    ((crn_packed_uint *)&(this->m_pHeader->m_color_selectors).m_size);
  symbol_codec::start_decoding(&this->m_codec,puVar1 + uVar2,uVar3);
  static_huffman_data_model::static_huffman_data_model((static_huffman_data_model *)local_40);
  symbol_codec::decode_receive_static_data_model
            (&this->m_codec,(static_huffman_data_model *)local_40);
  uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                    ((crn_packed_uint *)&(this->m_pHeader->m_color_selectors).m_num);
  vector<unsigned_int>::resize(&this->m_color_selectors,uVar2 << (dm.m_pDecode_tables._6_1_ & 1));
  j = 0;
  for (selector = 0;
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&(this->m_pHeader->m_color_selectors).m_num),
      selector < uVar2; selector = selector + 1) {
    for (t = 0; t < 0x20; t = t + 4) {
      uVar4 = symbol_codec::decode(&this->m_codec,(static_huffman_data_model *)local_40);
      j = uVar4 << ((byte)t & 0x1f) ^ j;
    }
    if ((dm.m_pDecode_tables._7_1_ & 1) == 0) {
      puVar5 = vector<unsigned_int>::operator[](&this->m_color_selectors,selector);
      *puVar5 = (j ^ j << 1) & 0xaaaaaaaa | j >> 1 & 0x55555555;
    }
    else {
      uVar2 = (j ^ 0xffffffff) & 0xaaaaaaaa | (j ^ j >> 1 ^ 0xffffffff) & 0x55555555;
      w = 8;
      for (s0 = 0; s0 < 4; s0 = s0 + 1) {
        for (s1 = 0; s1 < 4; s1 = s1 + 1) {
          if ((dm.m_pDecode_tables._6_1_ & 1) != 0) {
            uVar3 = uVar2 >> (((byte)(s1 << 3) | (byte)(s0 << 1)) & 0x1f);
            puVar5 = vector<unsigned_int>::operator[](&this->m_color_selectors,selector << 1);
            *puVar5 = (uVar3 >> 1 & 1 | (uVar3 & 1) << 0x10) << ((byte)w & 0xf) | *puVar5;
          }
          uVar3 = uVar2 >> (((byte)(s0 << 3) | (byte)(s1 << 1)) & 0x1f);
          if ((dm.m_pDecode_tables._6_1_ & 1) == 0) {
            local_d8 = selector;
          }
          else {
            local_d8 = selector << 1 | 1;
          }
          puVar5 = vector<unsigned_int>::operator[](&this->m_color_selectors,local_d8);
          *puVar5 = (uVar3 >> 1 & 1 | (uVar3 & 1) << 0x10) << ((byte)w & 0xf) | *puVar5;
          w = w + 4;
        }
        w = w - 0xf;
      }
    }
  }
  symbol_codec::stop_decoding(&this->m_codec);
  static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)local_40);
  return true;
}

Assistant:

bool decode_color_selectors()
        {
            const bool has_etc_color_blocks = m_pHeader->m_format == cCRNFmtETC1 || m_pHeader->m_format == cCRNFmtETC2 || m_pHeader->m_format == cCRNFmtETC2A || m_pHeader->m_format == cCRNFmtETC1S || m_pHeader->m_format == cCRNFmtETC2AS;
            const bool has_subblocks = m_pHeader->m_format == cCRNFmtETC1 || m_pHeader->m_format == cCRNFmtETC2 || m_pHeader->m_format == cCRNFmtETC2A;
            m_codec.start_decoding(m_pData + m_pHeader->m_color_selectors.m_ofs, m_pHeader->m_color_selectors.m_size);
            static_huffman_data_model dm;
            m_codec.decode_receive_static_data_model(dm);
            m_color_selectors.resize(m_pHeader->m_color_selectors.m_num << (has_subblocks ? 1 : 0));
            for (uint32 s = 0, i = 0; i < m_pHeader->m_color_selectors.m_num; i++)
            {
                for (uint32 j = 0; j < 32; j += 4)
                    s ^= m_codec.decode(dm) << j;
                if (has_etc_color_blocks)
                {
                    for (uint32 selector = (~s & 0xAAAAAAAA) | (~(s ^ s >> 1) & 0x55555555), t = 8, h = 0; h < 4; h++, t -= 15)
                    {
                        for (uint32 w = 0; w < 4; w++, t += 4)
                        {
                            if (has_subblocks)
                            {
                                uint32 s0 = selector >> (w << 3 | h << 1);
                                m_color_selectors[i << 1] |= ((s0 >> 1 & 1) | (s0 & 1) << 16) << (t & 15);
                            }
                            uint32 s1 = selector >> (h << 3 | w << 1);
                            m_color_selectors[has_subblocks ? i << 1 | 1 : i] |= ((s1 >> 1 & 1) | (s1 & 1) << 16) << (t & 15);
                        }
                    }
                }
                else
                {
                    m_color_selectors[i] = ((s ^ s << 1) & 0xAAAAAAAA) | (s >> 1 & 0x55555555);
                }
            }
            m_codec.stop_decoding();
            return true;
        }